

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derOIDDec(char *oid,size_t *len,octet *der,size_t count)

{
  char *pcVar1;
  size_t sVar2;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t oid_len;
  size_t pos;
  size_t l;
  u32 val;
  u32 d1;
  undefined8 in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  octet *in_stack_ffffffffffffffb8;
  long lVar3;
  size_t *in_stack_ffffffffffffffc0;
  octet **ppoVar4;
  octet **in_stack_ffffffffffffffc8;
  uint local_30;
  u32 local_2c;
  size_t local_8;
  
  local_2c = 3;
  local_30 = 0;
  local_8 = derDec2(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    in_stack_ffffffffffffffb0,(u32)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if (local_8 == 0xffffffffffffffff) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    lVar3 = 0;
    for (ppoVar4 = (octet **)0x0; ppoVar4 < in_stack_ffffffffffffffc8;
        ppoVar4 = (octet **)((long)ppoVar4 + 1)) {
      if ((local_30 & 0xfe000000) != 0) {
        return 0xffffffffffffffff;
      }
      if ((local_30 == 0) && (*(char *)(in_RDX + (long)ppoVar4) == -0x80)) {
        return 0xffffffffffffffff;
      }
      local_30 = local_30 << 7 | *(byte *)(in_RDX + (long)ppoVar4) & 0x7f;
      if ((*(byte *)(in_RDX + (long)ppoVar4) & 0x80) == 0) {
        if (local_2c == 3) {
          if (local_30 < 0x28) {
            local_2c = 0;
          }
          else if (local_30 < 0x50) {
            local_2c = 1;
            local_30 = local_30 - 0x28;
          }
          else {
            local_2c = 2;
            local_30 = local_30 - 0x50;
          }
          if (in_RDI == 0) {
            pcVar1 = (char *)0x0;
          }
          else {
            pcVar1 = (char *)(in_RDI + lVar3);
          }
          sVar2 = derSIDDec(pcVar1,local_2c);
          lVar3 = sVar2 + lVar3;
          local_2c = 0;
        }
        if (in_RDI != 0) {
          *(undefined1 *)(in_RDI + lVar3) = 0x2e;
        }
        lVar3 = lVar3 + 1;
        if (in_RDI == 0) {
          pcVar1 = (char *)0x0;
        }
        else {
          pcVar1 = (char *)(in_RDI + lVar3);
        }
        sVar2 = derSIDDec(pcVar1,local_30);
        lVar3 = sVar2 + lVar3;
        local_30 = 0;
      }
    }
    if (in_RDI != 0) {
      *(undefined1 *)(in_RDI + lVar3) = 0;
    }
    if (in_RSI != (long *)0x0) {
      *in_RSI = lVar3;
    }
  }
  return local_8;
}

Assistant:

size_t derOIDDec(char* oid, size_t* len, const octet der[], size_t count)
{
	u32 d1 = 3;
	u32 val = 0;
	size_t l, pos, oid_len;
	// pre
	ASSERT(memIsValid(der, count));
	// проверить тег и определить значение
	count = derDec2(&der, &l, der, count, 0x06);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	// обработать sid
	for (pos = oid_len = 0; pos < l; ++pos)
	{
		// переполнение?
		if (val & 0xFE000000)
			return SIZE_MAX;
		// лидирующий 0?
		if (val == 0 && der[pos] == 128)
			return SIZE_MAX;
		// обработать октет sid
		val <<= 7, val |= (size_t)der[pos] & 127;
		// последний октет sid?
		if ((der[pos] & 128) == 0)
		{
			// первый sid?
			if (d1 == 3)
			{
				if (val < 40)
					d1 = 0;
				else if (val < 80)
					d1 = 1, val -= 40;
				else
					d1 = 2, val -= 80;
				oid_len += derSIDDec(oid ? oid + oid_len : oid, d1);
				d1 = 0;
			}
			// добавить ".val"
			oid ? oid[oid_len++] = '.' : oid_len++;
			oid_len += derSIDDec(oid ? oid + oid_len : oid, val);
			// к следующему sid
			val = 0;
		}
	}
	// очистка и выход
	d1 = val = 0, pos = l = 0;
	oid ? oid[oid_len] = '\0' : oid_len;
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		ASSERT(oid == 0 || memIsDisjoint2(len, O_PER_S, oid, strLen(oid)));
		*len = oid_len;
	}
	return count;
}